

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

cmsysProcess * cmsysProcess_New(void)

{
  cmsysProcess *__s;
  
  __s = (cmsysProcess *)malloc(0x970);
  if (__s == (cmsysProcess *)0x0) {
    __s = (cmsysProcess *)0x0;
  }
  else {
    memset(__s,0,0x970);
    __s->PipeSharedSTDIN = 1;
    __s->PipeNativeSTDIN[0] = -1;
    __s->PipeNativeSTDIN[1] = -1;
    __s->PipeNativeSTDOUT[0] = -1;
    __s->PipeNativeSTDOUT[1] = -1;
    __s->PipeNativeSTDERR[0] = -1;
    __s->PipeNativeSTDERR[1] = -1;
    __s->State = 0;
  }
  return __s;
}

Assistant:

kwsysProcess* kwsysProcess_New(void)
{
  /* Allocate a process control structure.  */
  kwsysProcess* cp = (kwsysProcess*)malloc(sizeof(kwsysProcess));
  if (!cp) {
    return 0;
  }
  memset(cp, 0, sizeof(kwsysProcess));

  /* Share stdin with the parent process by default.  */
  cp->PipeSharedSTDIN = 1;

  /* No native pipes by default.  */
  cp->PipeNativeSTDIN[0] = -1;
  cp->PipeNativeSTDIN[1] = -1;
  cp->PipeNativeSTDOUT[0] = -1;
  cp->PipeNativeSTDOUT[1] = -1;
  cp->PipeNativeSTDERR[0] = -1;
  cp->PipeNativeSTDERR[1] = -1;

  /* Set initial status.  */
  cp->State = kwsysProcess_State_Starting;

  return cp;
}